

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateBufferHasIdentifier
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  string name;
  string file_identifier;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [8];
  long local_60;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  std::__cxx11::string::string
            (local_68,(string *)&((this->super_BaseGenerator).parser_)->file_identifier_);
  if ((((this->super_BaseGenerator).parser_)->root_struct_def_ == struct_def) && (local_60 != 0)) {
    (*(this->namer_).super_Namer._vptr_Namer[6])(&local_88,&this->namer_,struct_def);
    std::operator+(&local_a8,&local_88,"BufferHasIdentifier");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"_bb: ByteBuffer",&local_e9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Boolean",&local_ea);
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:910:9)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:910:9)>
               ::_M_manager;
    local_48._M_unused._M_object = writer;
    local_48._8_8_ = local_68;
    GenerateFunOneLine(writer,&local_a8,&local_c8,&local_e8,(function<void_()> *)&local_48,
                       options->gen_jvmstatic);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void GenerateBufferHasIdentifier(StructDef &struct_def, CodeWriter &writer,
                                   IDLOptions options) const {
    auto file_identifier = parser_.file_identifier_;
    // Check if a buffer has the identifier.
    if (parser_.root_struct_def_ != &struct_def || !file_identifier.length())
      return;
    auto name = namer_.Function(struct_def);
    GenerateFunOneLine(
        writer, name + "BufferHasIdentifier", "_bb: ByteBuffer", "Boolean",
        [&]() {
          writer += "__has_identifier(_bb, \"" + file_identifier + "\")";
        },
        options.gen_jvmstatic);
  }